

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v1.cpp
# Opt level: O0

void __thiscall
intel_acbp_v1_t::intel_acbp_v1_t
          (intel_acbp_v1_t *this,kstream *p__io,kstruct *p__parent,intel_acbp_v1_t *p__root)

{
  intel_acbp_v1_t *p__root_local;
  kstruct *p__parent_local;
  kstream *p__io_local;
  intel_acbp_v1_t *this_local;
  
  kaitai::kstruct::kstruct(&this->super_kstruct,p__io);
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__intel_acbp_v1_t_002292e0;
  std::
  unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>>>,std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>>>>,void>
            ((unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>>>,std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>>>>>
              *)&this->m_elements);
  this->m__parent = p__parent;
  this->m__root = this;
  std::
  unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_>_>
  ::operator=(&this->m_elements,(nullptr_t)0x0);
  _read(this);
  return;
}

Assistant:

intel_acbp_v1_t::intel_acbp_v1_t(kaitai::kstream* p__io, kaitai::kstruct* p__parent, intel_acbp_v1_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = this; (void)p__root;
    m_elements = nullptr;
    _read();
}